

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::~Branch(Branch *this)

{
  Branch *this_local;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_007d88e0;
  Own<kj::_::PromiseNode>::~Own(&this->dependency);
  Event::~Event(&this->super_Event);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::~Branch() noexcept(false) {}